

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_tree.cc
# Opt level: O1

int __thiscall sparse_tree::B(sparse_tree *this,int l,int j)

{
  uint uVar1;
  pointer pNVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  
  uVar7 = (ulong)(uint)l;
  pNVar2 = (this->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = -2;
  if (((((pNVar2[l].parent)->index != 0) && (pNVar2[l].pair < 0)) &&
      (iVar5 = -1, (pNVar2[l].parent)->pair <= j)) && (iVar4 = LCA(this,l,j), iVar5 = j, iVar4 != j)
     ) {
    for (piVar6 = *(int **)&pNVar2[iVar4].children.super__Vector_base<int,_std::allocator<int>_>;
        iVar5 = -100,
        piVar6 != *(pointer *)
                   ((long)&pNVar2[iVar4].children.super__Vector_base<int,_std::allocator<int>_> + 8)
        ; piVar6 = piVar6 + 1) {
      bVar3 = true;
      if (*piVar6 < j) {
        uVar1 = pNVar2[*piVar6].pair;
        bVar3 = (int)uVar1 <= l;
        uVar7 = uVar7 & 0xffffffff;
        if (l < (int)uVar1) {
          uVar7 = (ulong)uVar1;
        }
      }
      if (!bVar3) {
        return (int)uVar7;
      }
    }
  }
  return iVar5;
}

Assistant:

const int sparse_tree::B(int l, int j) const{
    if(tree[l].parent->index == 0 || tree[l].pair > -1) return -2;
    if ((tree[l].parent)->pair > j) return -1;
    else{
        int lca = LCA(l,j);
        if(j == lca) return j;
        for(int x:tree[lca].children){
            if(x<j && tree[x].pair > l) return tree[x].pair;
        }
        return -100;
    }
}